

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::ZoneBitVector::copyFrom
          (ZoneBitVector *this,ZoneAllocator *allocator,ZoneBitVector *other)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sbyte sVar4;
  Error EVar5;
  char cVar6;
  sbyte sVar7;
  ulong in_RCX;
  ulong uVar8;
  uint extraout_EDX;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ZoneAllocator *pZVar14;
  ZoneBitVector *pZVar15;
  ZoneAllocator *pZVar16;
  ulong in_R8;
  long lVar17;
  uint uVar18;
  ZoneAllocator *pZVar19;
  ZoneAllocator *unaff_R13;
  ZoneAllocator *pZVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t allocatedCapacity;
  uint uStack_94;
  ZoneAllocator *pZStack_88;
  ulong uStack_80;
  ulong uStack_78;
  ZoneAllocator *pZStack_70;
  ZoneAllocator *pZStack_68;
  ZoneAllocator *pZStack_60;
  ZoneBitVector *pZStack_58;
  code *pcStack_50;
  ulong local_48;
  ZoneBitVector *local_40;
  ulong local_38;
  ulong uVar13;
  
  uVar12 = *(uint *)(other + 8);
  uVar9 = (ulong)uVar12;
  if (uVar12 == 0) {
    *(undefined4 *)(this + 8) = 0;
    return 0;
  }
  pZVar20 = *(ZoneAllocator **)this;
  if (uVar12 <= *(uint *)(this + 0xc)) goto LAB_0012d1c7;
  uVar11 = uVar12 + 0x3f & 0xffffffc0;
  uVar13 = (ulong)uVar11;
  if (uVar11 < uVar12) {
    cVar6 = '\0';
    local_40 = other;
  }
  else {
    if (*(long *)allocator == 0) {
      pcStack_50 = (code *)0x12d247;
      pZVar14 = allocator;
      pZVar15 = this;
      copyFrom();
LAB_0012d247:
      uVar8 = uVar13;
LAB_0012d1aa:
      uVar11 = (uint)in_RCX;
      if (pZVar20 != (ZoneAllocator *)0x0) {
        if (*(long *)allocator == 0) {
          pcStack_50 = (code *)0x12d253;
          copyFrom();
        }
        else {
          pZVar15 = (ZoneBitVector *)(ulong)*(uint *)(this + 0xc);
          local_48 = uVar8;
          if (7 < *(uint *)(this + 0xc)) {
            in_RCX = in_RCX & 0xffffffff;
            pcStack_50 = (code *)0x12d230;
            copyFrom();
            uVar8 = local_48;
            goto LAB_0012d1af;
          }
        }
        pcStack_50 = _resize;
        copyFrom();
        uStack_78 = uVar13;
        pZStack_70 = allocator;
        pZStack_68 = unaff_R13;
        pZStack_60 = pZVar20;
        pZStack_58 = this;
        pcStack_50 = (code *)uVar9;
        if (extraout_EDX <= uVar11) {
          uVar13 = (ulong)extraout_EDX;
          uVar12 = *(uint *)((ZoneAllocator *)pZVar15 + 8);
          pZVar19 = (ZoneAllocator *)(ulong)uVar12;
          if (extraout_EDX <= uVar12) {
            uVar12 = extraout_EDX;
            if ((extraout_EDX & 0x3f) != 0) {
              puVar1 = (ulong *)(*(long *)pZVar15 + (ulong)(extraout_EDX >> 6) * 8);
              *puVar1 = *puVar1 & ~(-1L << (sbyte)(extraout_EDX & 0x3f));
            }
            goto LAB_0012d464;
          }
          pZVar20 = *(ZoneAllocator **)pZVar15;
          if (extraout_EDX <= *(uint *)((ZoneAllocator *)pZVar15 + 0xc)) goto LAB_0012d32e;
          uVar11 = uVar11 + 0x3f & 0xffffffc0;
          if (uVar11 < extraout_EDX) goto LAB_0012d4b2;
          if (*(long *)pZVar14 != 0) {
            uStack_94 = (uint)in_R8;
            pZVar16 = pZVar14;
            unaff_R13 = (ZoneAllocator *)
                        ZoneAllocator::_alloc(pZVar14,(ulong)(uVar11 >> 3),&uStack_80);
            pZVar16 = (ZoneAllocator *)
                      CONCAT71((int7)((ulong)pZVar16 >> 8),unaff_R13 != (ZoneAllocator *)0x0);
            if (unaff_R13 != (ZoneAllocator *)0x0) {
              uVar9 = uStack_80 * 8;
              pZStack_88 = pZVar14;
              if (uVar9 < uStack_80) goto LAB_0012d4be;
              goto LAB_0012d2e8;
            }
LAB_0012d31b:
            cVar6 = (char)pZVar16;
            in_R8 = (ulong)uStack_94;
            goto LAB_0012d320;
          }
          pZVar16 = (ZoneAllocator *)pZVar15;
          _resize();
LAB_0012d4be:
          uVar9 = (ulong)uVar11;
LAB_0012d2e8:
          if (0x3f < uVar12 + 0x3f) {
            uVar8 = 0;
            do {
              *(undefined8 *)(unaff_R13 + uVar8 * 8) = *(undefined8 *)(pZVar20 + uVar8 * 8);
              uVar8 = uVar8 + 1;
            } while (uVar12 + 0x3f >> 6 != uVar8);
          }
          if (pZVar20 == (ZoneAllocator *)0x0) {
LAB_0012d311:
            *(ZoneAllocator **)pZVar15 = unaff_R13;
            *(int *)((ZoneAllocator *)pZVar15 + 0xc) = (int)uVar9;
            pZVar20 = unaff_R13;
            goto LAB_0012d31b;
          }
          pZVar14 = pZVar16;
          if (*(long *)pZStack_88 != 0) {
            pZVar14 = (ZoneAllocator *)(ulong)*(uint *)((ZoneAllocator *)pZVar15 + 0xc);
            if (*(uint *)((ZoneAllocator *)pZVar15 + 0xc) < 8) goto LAB_0012d4d0;
            _resize();
            pZVar16 = (ZoneAllocator *)((ulong)pZVar16 & 0xffffffff);
            goto LAB_0012d311;
          }
LAB_0012d4cb:
          _resize();
LAB_0012d4d0:
          uVar11 = (uint)pZStack_88;
          _resize();
          uVar12 = 0xcb;
          if (uVar11 < 0xcb) {
            uVar12 = uVar11;
          }
          EVar5 = String::_opString((String *)pZVar14,kAppend,
                                    "None" + arm::FormatterInternal::formatFeature::sFeatureIndex
                                             [uVar12],0xffffffffffffffff);
          return EVar5;
        }
        _resize();
        pZVar19 = allocator;
        pZVar15 = (ZoneBitVector *)pZVar20;
        pZVar20 = (ZoneAllocator *)this;
LAB_0012d4b2:
        cVar6 = '\0';
LAB_0012d320:
        if (cVar6 == '\0') {
          return 1;
        }
LAB_0012d32e:
        pZVar14 = (ZoneAllocator *)((ulong)pZVar19 >> 6 & 0x3ffffff);
        uVar11 = (uint)pZVar14;
        uVar12 = (uint)uVar13;
        sVar4 = (sbyte)(uVar12 & 0x3f);
        lVar10 = -(in_R8 & 0xff);
        uVar18 = (uint)pZVar19 & 0x3f;
        if (((ulong)pZVar19 & 0x3f) != 0) {
          pZStack_88 = (ZoneAllocator *)(uVar13 >> 6);
          sVar7 = 0;
          if ((uVar11 == (uint)pZStack_88) && (sVar7 = sVar4, (uVar12 & 0x3f) <= uVar18)) {
            _resize();
            goto LAB_0012d4cb;
          }
          *(ulong *)(pZVar20 + (long)pZVar14 * 8) =
               *(ulong *)(pZVar20 + (long)pZVar14 * 8) | lVar10 << (sVar7 - (char)uVar18 & 0x3fU);
          uVar11 = uVar11 + 1;
        }
        auVar3 = _DAT_00150c20;
        auVar2 = _DAT_00150c10;
        uVar18 = uVar12 + 0x3f >> 6;
        if (uVar11 < uVar18) {
          uVar9 = (ulong)uVar11;
          lVar17 = (uVar18 - uVar9) + -1;
          auVar21._8_4_ = (int)lVar17;
          auVar21._0_8_ = lVar17;
          auVar21._12_4_ = (int)((ulong)lVar17 >> 0x20);
          uVar8 = 0;
          auVar21 = auVar21 ^ _DAT_00150c20;
          do {
            auVar22._8_4_ = (int)uVar8;
            auVar22._0_8_ = uVar8;
            auVar22._12_4_ = (int)(uVar8 >> 0x20);
            auVar22 = (auVar22 | auVar2) ^ auVar3;
            if ((bool)(~(auVar22._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar22._0_4_ ||
                        auVar21._4_4_ < auVar22._4_4_) & 1)) {
              *(long *)(pZVar20 + uVar8 * 8 + uVar9 * 8) = lVar10;
            }
            if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
                auVar22._12_4_ <= auVar21._12_4_) {
              *(long *)(pZVar20 + uVar8 * 8 + uVar9 * 8 + 8) = lVar10;
            }
            uVar8 = uVar8 + 2;
          } while (((uVar18 - uVar9) + 1 & 0xfffffffffffffffe) != uVar8);
        }
        if ((uVar13 & 0x3f) != 0) {
          uVar9 = 0;
          if ((char)in_R8 != '\0') {
            uVar9 = ~(-1L << sVar4);
          }
          *(ulong *)(pZVar20 + (ulong)(uVar18 - 1) * 8) = uVar9;
        }
LAB_0012d464:
        *(uint *)((ZoneAllocator *)pZVar15 + 8) = uVar12;
        return 0;
      }
LAB_0012d1af:
      *(ZoneAllocator **)this = unaff_R13;
      *(int *)(this + 0xc) = (int)uVar8;
      pZVar20 = unaff_R13;
    }
    else {
      pZVar14 = (ZoneAllocator *)(ulong)(uVar11 >> 3);
      pcStack_50 = (code *)0x12d189;
      pZVar15 = (ZoneBitVector *)allocator;
      local_40 = other;
      unaff_R13 = (ZoneAllocator *)ZoneAllocator::_alloc(allocator,(size_t)pZVar14,&local_38);
      in_RCX = CONCAT71((int7)(in_RCX >> 8),unaff_R13 != (ZoneAllocator *)0x0);
      if (unaff_R13 != (ZoneAllocator *)0x0) {
        uVar8 = local_38 * 8;
        if (local_38 * 8 < local_38) goto LAB_0012d247;
        goto LAB_0012d1aa;
      }
    }
    cVar6 = (char)in_RCX;
  }
  other = local_40;
  if (cVar6 == '\0') {
    return 1;
  }
LAB_0012d1c7:
  *(uint *)(this + 8) = uVar12;
  if (0x3f < uVar12 + 0x3f) {
    lVar10 = *(long *)other;
    uVar9 = 0;
    do {
      *(undefined8 *)(pZVar20 + uVar9 * 8) = *(undefined8 *)(lVar10 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar12 + 0x3f >> 6 != uVar9);
  }
  return 0;
}

Assistant:

Error ZoneBitVector::copyFrom(ZoneAllocator* allocator, const ZoneBitVector& other) noexcept {
  BitWord* data = _data;
  uint32_t newSize = other.size();

  if (!newSize) {
    _size = 0;
    return kErrorOk;
  }

  if (newSize > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(newSize, kBitWordSizeInBits);
    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  _size = newSize;
  _copyBits(data, other.data(), _wordsPerBits(newSize));

  return kErrorOk;
}